

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::nativeTerritoryName(QLocale *this)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  QSystemLocale *this_00;
  DataRange *in_RDI;
  long in_FS_OFFSET;
  QString *res;
  QVariant *in_stack_ffffffffffffff58;
  DataRange *this_01;
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4de0e2);
  if (pQVar2->m_data == &systemLocaleData) {
    in_RDI[2] = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
    *in_RDI = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
    in_RDI[1] = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = systemLocale();
    ::QVariant::QVariant((QVariant *)0x4de12d);
    (*this_00->_vptr_QSystemLocale[2])(local_28,this_00,0x29,local_48);
    ::QVariant::toString(in_stack_ffffffffffffff58);
    ::QVariant::~QVariant((QVariant *)this_00);
    ::QVariant::~QVariant((QVariant *)this_00);
    bVar1 = QString::isEmpty((QString *)0x4de184);
    if (!bVar1) goto LAB_004de22a;
    QString::~QString((QString *)0x4de1ef);
  }
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4de207);
  QLocaleData::endonymTerritory(pQVar2->m_data);
  QLocaleData::DataRange::getData(this_01,(char16_t *)in_RDI);
LAB_004de22a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::nativeTerritoryName() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res = systemLocale()->query(QSystemLocale::NativeTerritoryName).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    return d->m_data->endonymTerritory().getData(endonyms_data);
}